

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O2

int ffgtcm(fitsfile *gfptr,int cmopt,int *status)

{
  int iVar1;
  long member;
  fitsfile *mfptr;
  int local_e4;
  long nmembers;
  char keyvalue [71];
  char comment [73];
  
  nmembers = 0;
  mfptr = (fitsfile *)0x0;
  iVar1 = *status;
  if (iVar1 == 0) {
    local_e4 = cmopt;
    if ((cmopt == 1) || (cmopt == 0xb)) {
      iVar1 = ffgtnm(gfptr,&nmembers,status);
      *status = iVar1;
      member = 1;
      while ((member <= nmembers && (iVar1 == 0))) {
        iVar1 = ffgmop(gfptr,member,&mfptr,status);
        *status = iVar1;
        if (iVar1 == 0) {
          iVar1 = ffgkys(mfptr,"EXTNAME",keyvalue,comment,status);
          *status = iVar1;
          if (iVar1 == 0xca) {
            *status = 0;
            iVar1 = 0;
          }
          else {
            prepare_keyvalue(keyvalue);
            if (iVar1 == 0) {
              iVar1 = fits_strcasecmp(keyvalue,"GROUPING");
              if (iVar1 == 0) {
                iVar1 = ffgtmg(mfptr,gfptr,0,status);
                *status = iVar1;
                iVar1 = ffclos(mfptr,status);
                *status = iVar1;
                mfptr = (fitsfile *)0x0;
                if (local_e4 == 1) {
                  iVar1 = 1;
                }
                else {
                  iVar1 = 2;
                }
                iVar1 = ffgmrm(gfptr,member,iVar1,status);
                *status = iVar1;
              }
              else {
                iVar1 = ffclos(mfptr,status);
                *status = iVar1;
                mfptr = (fitsfile *)0x0;
              }
            }
          }
        }
        member = member + 1;
      }
    }
    else {
      *status = 0x15b;
      ffpmsg("Invalid value for cmopt parameter specified (ffgtcm)");
      iVar1 = *status;
    }
  }
  return iVar1;
}

Assistant:

int ffgtcm(fitsfile *gfptr,  /* FITS file pointer to grouping table          */
	   int       cmopt,  /* code specifying compact options
				OPT_CMT_MBR      (1) ==> compact only direct 
			                                 members (if groups)
				OPT_CMT_MBR_DEL (11) ==> (1) + delete all 
				                         compacted groups    */
	   int      *status) /* return status code                           */
    
/*
  "Compact" a group pointed to by the FITS file pointer gfptr. This 
  is achieved by flattening the tree structure of a group and its 
  (grouping table) members. All members HDUs of a grouping table which is 
  itself a member of the grouping table gfptr are added to gfptr. Optionally,
  the grouping tables which are "compacted" are deleted. If the grouping 
  table contains no members that are themselves grouping tables then this 
  function performs a NOOP.
*/

{
  long i;
  long nmembers = 0;

  char keyvalue[FLEN_VALUE];
  char comment[FLEN_COMMENT];

  fitsfile *mfptr = NULL;


  if(*status != 0) return(*status);

  do
    {
      if(cmopt != OPT_CMT_MBR && cmopt != OPT_CMT_MBR_DEL)
	{
	  *status = BAD_OPTION;
	  ffpmsg("Invalid value for cmopt parameter specified (ffgtcm)");
	  continue;
	}

      /* reteive the number of grouping table members */

      *status = fits_get_num_members(gfptr,&nmembers,status);

      /*
	loop over all the grouping table members; if the member is a 
	grouping table then merge its members with the parent grouping 
	table 
      */

      for(i = 1; i <= nmembers && *status == 0; ++i)
	{
	  *status = fits_open_member(gfptr,i,&mfptr,status);

	  if(*status != 0) continue;

	  *status = fits_read_key_str(mfptr,"EXTNAME",keyvalue,comment,status);

	  /* if no EXTNAME keyword then cannot be a grouping table */

	  if(*status == KEY_NO_EXIST) 
	    {
	      *status = 0;
	      continue;
	    }
	  prepare_keyvalue(keyvalue);

	  if(*status != 0) continue;

	  /* if EXTNAME == "GROUPING" then process member as grouping table */

	  if(fits_strcasecmp(keyvalue,"GROUPING") == 0)
	    {
	      /* merge the member (grouping table) into the grouping table */

	      *status = fits_merge_groups(mfptr,gfptr,OPT_MRG_COPY,status);

	      *status = fits_close_file(mfptr,status);
	      mfptr = NULL;

	      /* 
		 remove the member from the grouping table now that all of
		 its members have been transferred; if cmopt is set to
		 OPT_CMT_MBR_DEL then remove and delete the member
	      */

	      if(cmopt == OPT_CMT_MBR)
		*status = fits_remove_member(gfptr,i,OPT_RM_ENTRY,status);
	      else
		*status = fits_remove_member(gfptr,i,OPT_RM_MBR,status);
	    }
	  else
	    {
	      /* not a grouping table; just close the opened member */

	      *status = fits_close_file(mfptr,status);
	      mfptr = NULL;
	    }
	}

    }while(0);

  return(*status);
}